

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O2

Aig_Man_t *
introduceAbsorberLogic(Aig_Man_t *pAig,int *pLiveIndex_0,int *pLiveIndex_k,int nonFirstIteration)

{
  Aig_Man_t *p;
  size_t sVar1;
  char *__s;
  Aig_Obj_t *pAVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  ulong uVar7;
  Aig_Obj_t *pAVar8;
  int iVar9;
  int iVar10;
  Aig_Obj_t *local_48;
  
  if (*pLiveIndex_0 == -1) {
    __assert_fail("*pLiveIndex_0 != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                  ,0xb9,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
  }
  if (nonFirstIteration == 0) {
    if (*pLiveIndex_k != -1) {
      __assert_fail("*pLiveIndex_k == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                    ,0xbb,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
    }
  }
  else if (*pLiveIndex_k == -1) {
    __assert_fail("*pLiveIndex_k != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                  ,0xbd,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
  }
  p = Aig_ManStart(pAig->vObjs->nSize);
  sVar1 = strlen(pAig->pName);
  __s = (char *)malloc(sVar1 + 5);
  p->pName = __s;
  iVar9 = 0;
  sprintf(__s,"%s_%s",pAig->pName,"kCS");
  p->pSpec = (char *)0x0;
  pAVar2 = readLiveSignal_0(pAig,*pLiveIndex_0);
  if (*pLiveIndex_k == -1) {
    local_48 = (Aig_Obj_t *)0x0;
  }
  else {
    local_48 = readLiveSignal_k(pAig,*pLiveIndex_k);
  }
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  for (; iVar9 < pAig->nTruePis; iVar9 = iVar9 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCis,iVar9);
    pAVar4 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
  }
  for (iVar9 = 0; iVar9 < pAig->nRegs; iVar9 = iVar9 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar9);
    pAVar4 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
  }
  pAVar4 = Aig_ObjCreateCi(p);
  for (iVar10 = 0; iVar10 < pAig->vObjs->nSize; iVar10 = iVar10 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar10);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
      pAVar6 = Aig_ObjChild0Copy(pAVar5);
      if (((ulong)pAVar5 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
      }
      uVar7 = (ulong)pAVar5->pFanin1 & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        pAVar8 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar8 = (Aig_Obj_t *)((ulong)((uint)pAVar5->pFanin1 & 1) ^ *(ulong *)(uVar7 + 0x28));
      }
      pAVar6 = Aig_And(p,pAVar6,pAVar8);
      (pAVar5->field_5).pData = pAVar6;
    }
  }
  if (nonFirstIteration == 0) {
    if (pAVar2 == (Aig_Obj_t *)0x0) {
      __assert_fail("pPIn",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                    ,0x100,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
    }
    if (((ulong)pAVar2 & 1) == 0) {
      pAVar5 = (Aig_Obj_t *)(pAVar2->field_5).pData;
      pAVar2 = pAVar5;
    }
    else {
      pAVar5 = (Aig_Obj_t *)(*(ulong *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x28) ^ 1);
      pAVar2 = pAVar5;
    }
  }
  else {
    if (local_48 == (Aig_Obj_t *)0x0) {
      __assert_fail("pPOut",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                    ,0x10b,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
    }
    if (((ulong)pAVar2 & 1) == 0) {
      pAVar2 = (Aig_Obj_t *)(pAVar2->field_5).pData;
    }
    else {
      pAVar2 = (Aig_Obj_t *)(*(ulong *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x28) ^ 1);
    }
    if (((ulong)local_48 & 1) != 0) {
      pAVar5 = *(Aig_Obj_t **)(((ulong)local_48 & 0xfffffffffffffffe) + 0x28);
      goto LAB_004bfd42;
    }
    pAVar5 = (Aig_Obj_t *)(local_48->field_5).pData;
  }
  pAVar5 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
LAB_004bfd42:
  pAVar5 = Aig_Or(p,pAVar5,pAVar4);
  pAVar4 = Aig_Or(p,pAVar2,(Aig_Obj_t *)((ulong)pAVar4 ^ 1));
  pAVar2 = (Aig_Obj_t *)0x0;
  for (iVar10 = 0; iVar10 < pAig->nTruePos; iVar10 = iVar10 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar10);
    pAVar8 = Aig_ObjChild0Copy(pAVar6);
    pAVar8 = Aig_ObjCreateCo(p,pAVar8);
    (pAVar6->field_5).pData = pAVar8;
    if (iVar10 == *pLiveIndex_k) {
      pAVar2 = pAVar8;
    }
  }
  if (nonFirstIteration == 0) {
    if (pAVar2 != (Aig_Obj_t *)0x0) {
      __assert_fail("pPOutCo == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                    ,0x125,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
    }
    Aig_ObjCreateCo(p,pAVar4);
    *pLiveIndex_k = iVar10;
  }
  else {
    if (pAVar2 == (Aig_Obj_t *)0x0) {
      __assert_fail("pPOutCo != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                    ,300,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
    }
    Aig_ObjPatchFanin0(p,pAVar2,pAVar4);
  }
  for (iVar10 = 0; iVar10 < pAig->nRegs; iVar10 = iVar10 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar10);
    pAVar2 = Aig_ObjChild0Copy(pAVar2);
    Aig_ObjCreateCo(p,pAVar2);
  }
  Aig_ObjCreateCo(p,pAVar5);
  Aig_ManSetRegNum(p,iVar9 + 1);
  Aig_ManCleanup(p);
  iVar9 = Aig_ManCheck(p);
  if (iVar9 == 0) {
    __assert_fail("Aig_ManCheck( pNewAig )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                  ,0x140,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
  }
  if (*pLiveIndex_k == -1) {
    __assert_fail("*pLiveIndex_k != - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                  ,0x142,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
  }
  return p;
}

Assistant:

Aig_Man_t *introduceAbsorberLogic( Aig_Man_t *pAig, int *pLiveIndex_0, int *pLiveIndex_k, int nonFirstIteration )
{
	Aig_Man_t *pNewAig;
	Aig_Obj_t *pObj, *pObjAbsorberLo, *pPInNewArg, *pPOutNewArg;
	Aig_Obj_t *pPIn = NULL, *pPOut = NULL, *pPOutCo = NULL;
	Aig_Obj_t *pFirstAbsorberOr, *pSecondAbsorberOr;
	int i;
	int piCopied = 0, loCreated = 0, loCopied = 0, liCreated = 0, liCopied = 0; 
	int nRegCount;

	assert(*pLiveIndex_0 != -1);
	if(nonFirstIteration == 0)
		assert( *pLiveIndex_k == -1 );
	else
		assert( *pLiveIndex_k != -1  );

	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_kCS") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "kCS");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// reading the signal pIn, and pOut
	//****************************************************************

	pPIn = readLiveSignal_0( pAig, *pLiveIndex_0 );
	if( *pLiveIndex_k == -1 )
		pPOut = NULL;
	else
		pPOut = readLiveSignal_k( pAig, *pLiveIndex_k );
    
	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//****************************************************************
	// Step 6: create "D" register output for the ABSORBER logic
	//****************************************************************
	loCreated++;
	pObjAbsorberLo = Aig_ObjCreateCi( pNewAig );

	nRegCount = loCreated + loCopied;

	//********************************************************************
	// Step 7: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}

	//****************************************************************
	// Step 8: create the two OR gates of the OBSERVER logic
	//****************************************************************
	if( nonFirstIteration == 0 )
	{
		assert(pPIn);
		
		pPInNewArg = !Aig_IsComplement(pPIn)? 
				(Aig_Obj_t *)((Aig_Regular(pPIn))->pData) : 
				Aig_Not((Aig_Obj_t *)((Aig_Regular(pPIn))->pData));

		pFirstAbsorberOr = Aig_Or( pNewAig, Aig_Not(pPInNewArg), pObjAbsorberLo );
		pSecondAbsorberOr = Aig_Or( pNewAig, pPInNewArg, Aig_Not(pObjAbsorberLo) );
	}
	else
	{
		assert( pPOut );

		pPInNewArg = !Aig_IsComplement(pPIn)? 
				(Aig_Obj_t *)((Aig_Regular(pPIn))->pData) : 
				Aig_Not((Aig_Obj_t *)((Aig_Regular(pPIn))->pData));
		pPOutNewArg = !Aig_IsComplement(pPOut)? 
				(Aig_Obj_t *)((Aig_Regular(pPOut))->pData) : 
				Aig_Not((Aig_Obj_t *)((Aig_Regular(pPOut))->pData));
		
		pFirstAbsorberOr = Aig_Or( pNewAig, Aig_Not(pPOutNewArg), pObjAbsorberLo );
		pSecondAbsorberOr = Aig_Or( pNewAig, pPInNewArg, Aig_Not(pObjAbsorberLo) );
	}	
	
	//********************************************************************
	// Step 9: create primary outputs 
	//********************************************************************
	Saig_ManForEachPo( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
		if( i == *pLiveIndex_k )
			pPOutCo = (Aig_Obj_t *)(pObj->pData);
	}

	//create new po
	if( nonFirstIteration == 0 )
	{
		assert(pPOutCo == NULL);
		pPOutCo = Aig_ObjCreateCo( pNewAig, pSecondAbsorberOr ); 	

		*pLiveIndex_k = i;
	}	
	else
	{
		assert( pPOutCo != NULL );
		//pPOutCo = Aig_ObjCreateCo( pNewAig, pSecondAbsorberOr ); 	
		//*pLiveIndex_k = Saig_ManPoNum(pAig);

		Aig_ObjPatchFanin0( pNewAig, pPOutCo, pSecondAbsorberOr );
	}

	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}

	//create new li
	liCreated++;
	Aig_ObjCreateCo( pNewAig, pFirstAbsorberOr );

	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	
	assert( Aig_ManCheck( pNewAig ) );

	assert( *pLiveIndex_k != - 1);
	return pNewAig;
}